

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

RGBFilm * pbrt::RGBFilm::Create
                    (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
                    RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  Point2<int> *pPVar1;
  int iVar2;
  PixelSensor *sensor;
  undefined4 extraout_var;
  bool writeFP16;
  Float maxComponentValue;
  FilmBaseParameters filmBaseParameters;
  bool local_ad;
  Float local_ac;
  Float local_a8;
  Float local_a4;
  FilterHandle *local_a0;
  RGBColorSpace *local_98;
  polymorphic_allocator<std::byte> local_90;
  FilmBaseParameters local_88;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_38;
  
  pPVar1 = &local_88.pixelBounds.pMax;
  local_a8 = exposureTime;
  local_a0 = filter;
  local_98 = colorSpace;
  local_90.memoryResource = alloc.memoryResource;
  local_88.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"maxcomponentvalue","");
  local_a4 = ParameterDictionary::GetOneFloat(parameters,(string *)&local_88,INFINITY);
  if (local_88.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    local_ac = local_a4;
    operator_delete((void *)local_88.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_88.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
    local_a4 = local_ac;
  }
  local_88.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"savefp16","");
  local_ad = ParameterDictionary::GetOneBool(parameters,(string *)&local_88,true);
  if (local_88.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    operator_delete((void *)local_88.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_88.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
  }
  sensor = PixelSensor::Create(parameters,colorSpace,local_a8,loc,alloc);
  local_38.bits =
       (local_a0->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FilmBaseParameters::FilmBaseParameters(&local_88,parameters,(FilterHandle *)&local_38,sensor,loc);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xa8,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::RGBFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&local_90,(RGBFilm *)CONCAT44(extraout_var,iVar2),&local_88,&local_98,&local_a4,
             &local_ad,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.filename._M_dataplus._M_p != &local_88.filename.field_2) {
    operator_delete(local_88.filename._M_dataplus._M_p,
                    local_88.filename.field_2._M_allocated_capacity + 1);
  }
  return (RGBFilm *)CONCAT44(extraout_var,iVar2);
}

Assistant:

RGBFilm *RGBFilm::Create(const ParameterDictionary &parameters, Float exposureTime,
                         FilterHandle filter, const RGBColorSpace *colorSpace,
                         const FileLoc *loc, Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);
    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    return alloc.new_object<RGBFilm>(filmBaseParameters, colorSpace, maxComponentValue,
                                     writeFP16, alloc);
}